

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LoopBreakLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_loopbreak(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  LoopBreakLayerParams *pLVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_loopbreak(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_loopbreak(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pLVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::LoopBreakLayerParams>(arena);
    (this->layer_).loopbreak_ = pLVar2;
  }
  return (LoopBreakLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopBreakLayerParams* NeuralNetworkLayer::_internal_mutable_loopbreak() {
  if (!_internal_has_loopbreak()) {
    clear_layer();
    set_has_loopbreak();
    layer_.loopbreak_ = CreateMaybeMessage< ::CoreML::Specification::LoopBreakLayerParams >(GetArenaForAllocation());
  }
  return layer_.loopbreak_;
}